

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl-intercept.cpp
# Opt level: O2

char * la_objsearch(char *name,uintptr_t *cookie,uint flag)

{
  size_type sVar1;
  pointer pbVar2;
  char *pcVar3;
  long lVar4;
  istream *piVar5;
  mapped_type *this;
  ostream *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_R14;
  __node_base *p_Var7;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  substitution_pairs;
  string dl_substitutions;
  is_any_ofF<char> local_250;
  string obj_name;
  byte abStack_218 [488];
  
  if (flag == 1) {
    if (initialized == '\0') {
      pcVar3 = getenv("RTLD_SUBSTITUTIONS");
      if (pcVar3 != (char *)0x0) {
        std::__cxx11::string::string((string *)&dl_substitutions,pcVar3,(allocator *)&obj_name);
        substitution_pairs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        substitution_pairs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        substitution_pairs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar4 = std::__cxx11::string::find((string *)&dl_substitutions,':',0);
        if (lVar4 == -1) {
          std::ifstream::ifstream((ifstream *)&obj_name);
          std::ifstream::open((ifstream *)&obj_name,(string *)&dl_substitutions,_S_in);
          if ((abStack_218[*(long *)(obj_name._M_dataplus._M_p + -0x18)] & 1) != 0) {
            poVar6 = std::operator<<((ostream *)&std::cout,
                                     "ERROR: Failure to open substitutions file ");
            poVar6 = std::operator<<(poVar6,(string *)&dl_substitutions);
            std::endl<char,std::char_traits<char>>(poVar6);
            exit(1);
          }
          line._M_dataplus._M_p = (pointer)&line.field_2;
          line._M_string_length = 0;
          line.field_2._M_allocated_capacity =
               line.field_2._M_allocated_capacity & 0xffffffffffffff00;
          while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&obj_name,(string *)&line),
                ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
            boost::algorithm::erase_all<std::__cxx11::string,char[2]>(&line,(char (*) [2])" ");
            if (((3 < line._M_string_length) &&
                (pcVar3 = (char *)std::__cxx11::string::at((string *)&line,0), *pcVar3 != '#')) &&
               (lVar4 = std::__cxx11::string::find((string *)&line,':',0), lVar4 != -1)) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&substitution_pairs,&line);
            }
          }
          std::ifstream::close((ifstream *)&obj_name);
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream((ifstream *)&obj_name);
        }
        else {
          boost::algorithm::is_any_of<char[2]>((is_any_ofF<char> *)&obj_name,(char (*) [2])",");
          boost::algorithm::
          split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
                    (&substitution_pairs,&dl_substitutions,(is_any_ofF<char> *)&obj_name,
                     token_compress_off);
          boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF((is_any_ofF<char> *)&obj_name);
        }
        pbVar2 = substitution_pairs.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (unaff_R14 = substitution_pairs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; unaff_R14 != pbVar2;
            unaff_R14 = unaff_R14 + 1) {
          line._M_dataplus._M_p = (pointer)0x0;
          line._M_string_length = 0;
          line.field_2._M_allocated_capacity = 0;
          boost::algorithm::is_any_of<char[2]>(&local_250,(char (*) [2])":");
          boost::algorithm::
          split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const&,boost::algorithm::detail::is_any_ofF<char>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&line,unaff_R14,&local_250,token_compress_off);
          boost::algorithm::detail::is_any_ofF<char>::~is_any_ofF(&local_250);
          sVar1 = line._M_string_length;
          if (line._M_string_length - (long)line._M_dataplus._M_p == 0x40) {
            this = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)&substitutions_abi_cxx11_,(key_type *)line._M_dataplus._M_p);
            std::__cxx11::string::_M_assign((string *)this,(string *)(sVar1 - 0x20));
          }
          else {
            poVar6 = std::operator<<((ostream *)&std::cout,"Formatting error in substitution pair: "
                                    );
            poVar6 = std::operator<<(poVar6,(string *)unaff_R14);
            std::endl<char,std::char_traits<char>>(poVar6);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&line);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&substitution_pairs);
        std::__cxx11::string::~string((string *)&dl_substitutions);
      }
      initialized = '\x01';
    }
    std::__cxx11::string::string((string *)&obj_name,name,(allocator *)&dl_substitutions);
    p_Var7 = &substitutions_abi_cxx11_._M_h._M_before_begin;
    do {
      p_Var7 = p_Var7->_M_nxt;
      if (p_Var7 == (__node_base *)0x0) goto LAB_001840b9;
      lVar4 = std::__cxx11::string::find((string *)&obj_name,(string *)(p_Var7 + 1),0);
    } while (lVar4 == -1);
    unaff_R14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                p_Var7[5]._M_nxt;
LAB_001840b9:
    std::__cxx11::string::~string((string *)&obj_name);
    if (p_Var7 != (__node_base *)0x0) {
      return (char *)unaff_R14;
    }
  }
  return name;
}

Assistant:

char *la_objsearch(const char *name, uintptr_t *cookie, unsigned int flag) {
  // Catch the initial name of the object the loader is looking for
  if(flag == LA_SER_ORIG) {
    // Initialize environment variables
    if(!initialized) {
      process_environment_variables();
      initialized = true;
    }

    std::string obj_name(name);

    for(auto const& kv : substitutions) {
      // If a searched name matches a key, return the mapped value
      // If the key is an absolute filepath the loader will not search anywhere else
      if(obj_name.find(kv.first) != std::string::npos) {
          return (char*)kv.second.c_str();
      }
    }
  }

  return (char*)name;
}